

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_ineq.h
# Opt level: O0

void __thiscall
mp::
Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>
::ConvertCondIneq<_1>
          (Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
           *this,ItemType *cc,int value,double eps)

{
  bool bVar1;
  AlgConRhs<_1> rr;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_> *this_00;
  int in_EDX;
  FunctionalConstraint *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  NodeRange NVar3;
  int res;
  ConType *con;
  undefined8 in_stack_fffffffffffff5e8;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff5f0;
  QuadAndLinTerms *in_stack_fffffffffffff5f8;
  QuadAndLinTerms *in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff60c;
  undefined1 uVar4;
  QuadAndLinTerms *in_stack_fffffffffffff610;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_fffffffffffff618;
  AlgConRhs<_1> in_stack_fffffffffffff620;
  AlgConRhs<_1> local_998 [6];
  double in_stack_fffffffffffff698;
  double in_stack_fffffffffffff6a0;
  int in_stack_fffffffffffff6ac;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff6b0;
  AlgConRhs<_1> local_3d0 [116];
  int local_2c;
  ConType *local_28;
  double local_20;
  undefined4 local_14;
  FunctionalConstraint *local_10;
  
  uVar4 = (undefined1)((uint)in_stack_fffffffffffff60c >> 0x18);
  var = (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20);
  local_20 = in_XMM0_Qa;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28 = ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>
             ::GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                              *)0x27b4d1);
  local_2c = FunctionalConstraint::GetResultVar(local_10);
  bVar1 = AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::empty
                    ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)0x27b4fa);
  if (bVar1) {
    dVar2 = AlgConRhs<-1>::rhs(&local_28->super_AlgConRhs<_1>);
    if (0.0 < (dVar2 + local_20) * -1.0) {
      BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::GetMC(in_RDI);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                        in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    }
  }
  else {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::is_fixed(in_stack_fffffffffffff5f0,var);
    if (bVar1) {
      BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::GetMC(in_RDI);
      dVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::fixed_value(in_stack_fffffffffffff5f0,var);
      if (((double)local_14 == dVar2) && (!NAN((double)local_14) && !NAN(dVar2))) {
        rr.rhs_ = (double)BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ::GetMC(in_RDI);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::GetBody(local_28);
        QuadAndLinTerms::QuadAndLinTerms(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
        dVar2 = AlgConRhs<-1>::rhs(&local_28->super_AlgConRhs<_1>);
        AlgConRhs<-1>::AlgConRhs(local_3d0,dVar2 + local_20);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff618,in_stack_fffffffffffff610,rr,(bool)uVar4);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)rr.rhs_,
                   (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff618);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff5f0);
        QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff5f0);
      }
    }
    else {
      this_00 = (IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                 *)BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   ::GetMC(in_RDI);
      uVar4 = local_14._3_1_;
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::GetBody(local_28);
      QuadAndLinTerms::QuadAndLinTerms((QuadAndLinTerms *)this_00,in_stack_fffffffffffff5f8);
      dVar2 = AlgConRhs<-1>::rhs(&local_28->super_AlgConRhs<_1>);
      AlgConRhs<-1>::AlgConRhs(local_998,dVar2 + local_20);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                 in_stack_fffffffffffff618,in_stack_fffffffffffff610,in_stack_fffffffffffff620,
                 (bool)uVar4);
      IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
      IndicatorConstraint(this_00,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
                          (int)in_stack_fffffffffffff5f8,
                          (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                          in_stack_fffffffffffff5f0);
      NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)in_stack_fffffffffffff620.rhs_,in_stack_fffffffffffff618);
      IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
      ~IndicatorConstraint
                ((IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                  *)NVar3.ir_);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)NVar3.ir_);
      QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)NVar3.ir_);
    }
  }
  return;
}

Assistant:

void ConvertCondIneq(const ItemType& cc, int value, double eps) {
    const auto& con = cc.GetConstraint();
    const auto res = cc.GetResultVar();
    using AlgConOutput = AlgebraicConstraint<
      typename AlgCon::BodyType, AlgConRhs<kind> >;
    if (con.empty()) {                    // empty body
      if (kind*(con.rhs() + eps) > 0.0)
        GetMC().NarrowVarBounds(res, !value, !value);    // fix result
    } else {
      if (GetMC().is_fixed(res)) {
        if (value==GetMC().fixed_value(res)) { // result already fixed,
          GetMC().AddConstraint(               // add static constraint
                AlgConOutput{ con.GetBody(), con.rhs()+eps } );
        }                                      // otherwise, forget
      } else {
        GetMC().AddConstraint( IndicatorConstraint< AlgConOutput >(
                                res, value,
                                { con.GetBody(), con.rhs()+eps }));
      }
    }
  }